

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::mouseMoveEvent(DateTimePicker *this,QMouseEvent *event)

{
  DateTimePickerPrivate *this_00;
  QPoint QVar1;
  QMouseEvent QVar2;
  
  QVar2 = (QMouseEvent)(((this->d).d)->leftMouseButtonPressed == true);
  if ((bool)QVar2) {
    QVar1 = QMouseEvent::pos(event);
    this_00 = (this->d).d;
    DateTimePickerPrivate::updateOffset(this_00,QVar1.yp - (this_00->mousePos).yp);
    QVar1 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar1;
    QWidget::update();
  }
  event[0xc] = QVar2;
  return;
}

Assistant:

void
DateTimePicker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().y() - d->mousePos.y();
		d->updateOffset( delta );
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}